

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O2

void __thiscall
SDLInputJoystickManager::GetDevices
          (SDLInputJoystickManager *this,TArray<IJoystickConfig_*,_IJoystickConfig_*> *sticks)

{
  SDLInputJoystick *in_RAX;
  uint i;
  ulong uVar1;
  SDLInputJoystick *local_28;
  
  local_28 = in_RAX;
  for (uVar1 = 0; uVar1 < (this->Joysticks).Count; uVar1 = uVar1 + 1) {
    M_LoadJoystickConfig(&(this->Joysticks).Array[uVar1]->super_IJoystickConfig);
    local_28 = (this->Joysticks).Array[uVar1];
    TArray<IJoystickConfig_*,_IJoystickConfig_*>::Push(sticks,(IJoystickConfig **)&local_28);
  }
  return;
}

Assistant:

void GetDevices(TArray<IJoystickConfig *> &sticks)
	{
		for(unsigned int i = 0;i < Joysticks.Size();i++)
		{
			M_LoadJoystickConfig(Joysticks[i]);
			sticks.Push(Joysticks[i]);
		}
	}